

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O3

void __thiscall
xemmai::t_static<double_(*)(double),_&fabs>::t_bind<xemmai::t_math>::f_call
          (t_bind<xemmai::t_math> *this,t_library *a_library,t_pvalue *a_stack,size_t a_n)

{
  long lVar1;
  double dVar2;
  t_object *p;
  long extraout_RDX;
  long extraout_RDX_00;
  double __y;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  if (a_stack == (t_pvalue *)0x1) {
    t_signature<double>::f_check<0ul>(a_library + 0x20);
    lVar1 = *(long *)(a_library + 0x20);
    if (lVar1 == 4) {
      dVar2 = *(double *)(a_library + 0x28);
    }
    else if (lVar1 == 3) {
      dVar2 = (double)*(long *)(a_library + 0x28);
    }
    else {
      dVar2 = *(double *)(lVar1 + 0x48);
    }
    *(undefined8 *)a_library = 4;
    *(double *)(a_library + 8) = ABS(dVar2);
    return;
  }
  t_static<double(*)(double),&fabs>::t_bind<xemmai::t_math>::f_call();
  if (extraout_RDX == 1) {
    t_signature<double>::f_check<0ul>(a_library + 0x20);
    lVar1 = *(long *)(a_library + 0x20);
    if (lVar1 == 4) {
      dVar2 = *(double *)(a_library + 0x28);
    }
    else if (lVar1 == 3) {
      dVar2 = (double)*(long *)(a_library + 0x28);
    }
    else {
      dVar2 = *(double *)(lVar1 + 0x48);
    }
    dVar2 = floor(dVar2);
    *(undefined8 *)a_library = 4;
    *(double *)(a_library + 8) = dVar2;
    return;
  }
  t_static<double(*)(double),&floor>::t_bind<xemmai::t_math>::f_call();
  if (extraout_RDX_00 == 2) {
    t_signature<double,double>::f_check<0ul,1ul>(a_library + 0x20);
    t_signature<double,double>::
    f_call<&(xemmai::t_value<xemmai::t_pointer>xemmai::t_static<double(*)(double,double),&fmod>::t_bind<xemmai::t_math>::f_function<double,double>(xemmai::t_library*,xemmai::t_value<xemmai::t_pointer>const&,double&&,double&&)),0ul,1ul>
              (&uStack_48,this,a_library + 0x10,a_library + 0x20);
    *(undefined8 *)a_library = uStack_48;
    *(undefined8 *)(a_library + 8) = uStack_40;
    return;
  }
  t_static<double(*)(double,double),&fmod>::t_bind<xemmai::t_math>::f_call();
  lVar1 = *(long *)a_n;
  if (lVar1 == 4) {
    dVar2 = *(double *)(a_n + 8);
  }
  else if (lVar1 == 3) {
    dVar2 = (double)*(long *)(a_n + 8);
  }
  else {
    dVar2 = *(double *)(lVar1 + 0x48);
  }
  lVar1 = *(long *)(a_n + 0x10);
  if (lVar1 == 4) {
    __y = *(double *)(a_n + 0x18);
  }
  else if (lVar1 == 3) {
    __y = (double)*(long *)(a_n + 0x18);
  }
  else {
    __y = *(double *)(lVar1 + 0x48);
  }
  dVar2 = fmod(dVar2,__y);
  *(undefined8 *)this = 4;
  *(double *)(this + 8) = dVar2;
  return;
}

Assistant:

static void f_check(size_t a_n)
	{
		if (a_n != sizeof...(T_an)) [[unlikely]] f_throw((t_cs<L'm', L'u', L's', L't', L' ', L'b', L'e', L' ', L'c', L'a', L'l', L'l', L'e', L'd', L' ', L'w', L'i', L't', L'h', L' '>() + typename t_n2s<sizeof...(T_an)>::t() + t_cs<L' ', L'a', L'r', L'g', L'u', L'm', L'e', L'n', L't', L'(', L's', L')', L'.'>()).v);
	}